

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptimeprofiler_test.cpp
# Opt level: O2

pint p_test_case_ptimeprofiler_nomem_test(void)

{
  int iVar1;
  long lVar2;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  iVar1 = p_mem_set_vtable();
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptimeprofiler_test.cpp"
           ,0x3b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_time_profiler_new();
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptimeprofiler_test.cpp"
           ,0x3d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_mem_restore_vtable();
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (ptimeprofiler_nomem_test)
{
	p_libsys_init ();

	PMemVTable vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

	P_TEST_CHECK (p_time_profiler_new () == NULL);

	p_mem_restore_vtable ();

	p_libsys_shutdown ();
}